

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O2

Geodesic * Geodesic::getGeodesic(Geodesic *__return_storage_ptr__,PhyloTree *t1,PhyloTree *t2)

{
  bool bVar1;
  pointer pbVar2;
  invalid_argument *piVar3;
  ulong uVar4;
  pointer pbVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  vector<PhyloTree,_std::allocator<PhyloTree>_> aTreesNoCommonEdges;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> eic;
  vector<PhyloTree,_std::allocator<PhyloTree>_> bTreesNoCommonEdges;
  RatioSequence local_a8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_88;
  Geodesic newGeo;
  
  RatioSequence::RatioSequence(&newGeo.rs);
  Geodesic(__return_storage_ptr__,&newGeo.rs);
  std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&newGeo.rs._RatioSequence);
  pbVar5 = (t1->leaf2NumMap).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (t1->leaf2NumMap).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar2 - (long)pbVar5 !=
      (long)(t2->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(t2->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar3,"Error getting geodesic: trees do not have the same number of leaves");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  dVar7 = 0.0;
  lVar6 = 0;
  uVar4 = 0;
  while( true ) {
    if ((ulong)((long)pbVar2 - (long)pbVar5 >> 5) <= uVar4) {
      __return_storage_ptr__->leafContributionSquared = dVar7;
      aTreesNoCommonEdges.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bTreesNoCommonEdges.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      aTreesNoCommonEdges.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      aTreesNoCommonEdges.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bTreesNoCommonEdges.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bTreesNoCommonEdges.super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      splitOnCommonEdge(&t1->edges,&t2->edges,&t1->leaf2NumMap,&aTreesNoCommonEdges,
                        &bTreesNoCommonEdges);
      eic.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      eic.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      eic.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      PhyloTree::getCommonEdges(&t1->edges,&t2->edges,&eic);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector(&local_88,&eic);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_M_move_assign
                (&__return_storage_ptr__->commonEdges,&local_88);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_88);
      lVar6 = 0;
      for (uVar4 = 0;
          uVar4 < (ulong)(((long)aTreesNoCommonEdges.
                                 super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)aTreesNoCommonEdges.
                                super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x68); uVar4 = uVar4 + 1) {
        getGeodesicNoCommonEdges
                  (&newGeo,(PhyloTree *)
                           ((long)&((aTreesNoCommonEdges.
                                     super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->newick)._M_dataplus.
                                   _M_p + lVar6),
                   (PhyloTree *)
                   ((long)&((bTreesNoCommonEdges.
                             super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>._M_impl.
                             super__Vector_impl_data._M_start)->newick)._M_dataplus._M_p + lVar6));
        RatioSequence::interleave(&local_a8,&__return_storage_ptr__->rs,&newGeo.rs);
        RatioSequence::operator=(&__return_storage_ptr__->rs,&local_a8);
        std::vector<Ratio,_std::allocator<Ratio>_>::~vector(&local_a8._RatioSequence);
        ~Geodesic(&newGeo);
        lVar6 = lVar6 + 0x68;
      }
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&eic);
      std::vector<PhyloTree,_std::allocator<PhyloTree>_>::~vector(&bTreesNoCommonEdges);
      std::vector<PhyloTree,_std::allocator<PhyloTree>_>::~vector(&aTreesNoCommonEdges);
      return __return_storage_ptr__;
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar5->_M_dataplus)._M_p + lVar6),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(((t2->leaf2NumMap).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar6));
    if (bVar1) break;
    dVar8 = (t1->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4] -
            (t2->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    dVar7 = dVar7 + dVar8 * dVar8;
    uVar4 = uVar4 + 1;
    pbVar5 = (t1->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (t1->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = lVar6 + 0x20;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar3,"Error getting geodesic: trees do not have the same sets of leaves");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Geodesic Geodesic::getGeodesic(PhyloTree &t1, PhyloTree &t2) {
    double leafContributionSquared = 0;
    vector<double>& t1_leaf_lengths = t1.leafEdgeLengths;
    vector<double>& t2_leaf_lengths = t2.leafEdgeLengths;
    Geodesic geo = Geodesic(RatioSequence());

    // get the leaf contributions
    auto& ref_leaf_num_map = t1.leaf2NumMap;
    auto& chk_leaf_num_map = t2.leaf2NumMap;
    if (ref_leaf_num_map.size() != chk_leaf_num_map.size()) {
        throw invalid_argument("Error getting geodesic: trees do not have the same number of leaves");
    }
    for (size_t i = 0; i < ref_leaf_num_map.size(); i++) {
        if (ref_leaf_num_map[i] != chk_leaf_num_map[i]) {
            throw invalid_argument("Error getting geodesic: trees do not have the same sets of leaves");
        }
        leafContributionSquared += pow(t1_leaf_lengths[i] - t2_leaf_lengths[i], 2);
    }
    geo.setLeafContributionSquared(leafContributionSquared);

    vector<PhyloTree> aTreesNoCommonEdges;
    vector<PhyloTree> bTreesNoCommonEdges;

    // get the pairs of trees with no common edges put into aTreesNoCommonEdges and bTreesNoCommonEdges
    //  aTreesNoCommonEdges[i] goes with bTreesNoCommonEdges[i]
    auto& t1_edges = t1.edges;
    auto& t2_edges = t2.edges;
    auto& l2nm = t1.leaf2NumMap;
    splitOnCommonEdge(t1_edges, t2_edges, l2nm, aTreesNoCommonEdges, bTreesNoCommonEdges);
//    splitOnCommonEdge(t1, t2, aTreesNoCommonEdges, bTreesNoCommonEdges);
    //set the common edges
    vector<PhyloTreeEdge> eic;
    PhyloTree::getCommonEdges(t1_edges, t2_edges, eic);
    geo.setCommonEdges(eic);

    // find the geodesic between each pair of subtrees found by removing the common edges
    for (size_t i = 0; i < aTreesNoCommonEdges.size(); i++) {
        Geodesic newGeo = getGeodesicNoCommonEdges(aTreesNoCommonEdges[i], bTreesNoCommonEdges[i]);
        geo.setRS(RatioSequence::interleave(geo.getRS(), newGeo.getRS()));
    }
    return geo;
}